

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O3

bool __thiscall FIX::ExeceptionStore::set(ExeceptionStore *this,int param_1,string *param_2)

{
  IOException *this_00;
  undefined4 in_register_00000034;
  string local_40;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x50,CONCAT44(in_register_00000034,param_1));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set threw an IOException","")
  ;
  IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

bool set( int, const std::string& ) EXCEPT ( IOException ) {
    throw IOException("set threw an IOException");
  }